

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Texture.cpp
# Opt level: O1

uint64_t __thiscall
GmmLib::GmmGen12TextureCalc::ScaleFCRectWidth
          (GmmGen12TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint64_t Width)

{
  GMM_TILE_MODE GVar1;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  ulong uVar5;
  uint uVar6;
  char cVar7;
  
  if (((ulong)(pTexInfo->Flags).Gpu & 2) == 0) {
    return Width;
  }
  iVar3 = (*((this->super_GmmGen11TextureCalc).super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
             super_GmmTextureCalc.pGmmLibContext)->pPlatformInfo->_vptr_PlatformInfo[10])();
  GVar1 = pTexInfo->TileMode;
  uVar5 = (ulong)GVar1;
  if (uVar5 < 0x30) {
    if ((0xf8000003e000U >> (uVar5 & 0x3f) & 1) == 0) {
      cVar7 = '\0';
      if (uVar5 != 2) goto LAB_001b6549;
    }
    else {
LAB_001b6579:
      cVar7 = '\x05';
      if (((4 < GVar1 - TILE_YF_2D_8bpe) && (cVar7 = '\n', 4 < GVar1 - TILE_YS_2D_8bpe)) &&
         (cVar7 = '\x14', 4 < GVar1 - TILE__64_2D_8bpe)) {
        cVar7 = (4 < GVar1 - TILE__64_3D_8bpe) * '\x05' + '\x19';
      }
    }
  }
  else {
LAB_001b6549:
    bVar2 = 0x1e;
    uVar6 = GVar1 - TILE4;
    if (0x19 < uVar6) goto LAB_001b65cc;
    if ((0x3e007c0U >> (uVar6 & 0x1f) & 1) != 0) goto LAB_001b6579;
    if (uVar6 != 0) goto LAB_001b65cc;
    cVar7 = '\x0f';
  }
  uVar4 = __GmmLog2(pTexInfo->BitsPerPixel);
  bVar2 = ((char)uVar4 + cVar7) - 3;
LAB_001b65cc:
  if (bVar2 < 0x1e) {
    uVar5 = (ulong)(*(int *)(CONCAT44(extraout_var,iVar3) + (ulong)bVar2 * 0x18) - 1);
    Width = (~uVar5 & Width + uVar5) /
            (ulong)(long)*(int *)(CONCAT44(extraout_var,iVar3) + 0xc + (ulong)bVar2 * 0x18);
  }
  return Width;
}

Assistant:

uint64_t GMM_STDCALL GmmLib::GmmGen12TextureCalc::ScaleFCRectWidth(GMM_TEXTURE_INFO *pTexInfo, uint64_t Width)
{
    uint64_t ScaledWidth = Width;
    if(pTexInfo->Flags.Gpu.CCS)
    {
        CCS_UNIT *FCRectAlign = static_cast<PlatformInfoGen12 *>(pGmmLibContext->GetPlatformInfoObj())->GetFCRectAlign();	    
        uint8_t   index       = FCMaxModes;
        if((index = FCMode(pTexInfo->TileMode, pTexInfo->BitsPerPixel)) < FCMaxModes)
        {
            ScaledWidth = GFX_ALIGN(ScaledWidth, FCRectAlign[index].Align.Width);
            ScaledWidth /= FCRectAlign[index].Downscale.Width;
        }
        else
        {
            //Unsupported tiling-type for FastClear
            __GMM_ASSERT(0);
        }
    }

    return ScaledWidth;
}